

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BasicCommands.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/farrrb[P]XcpLight/tests/test_BasicCommands.c"
            );
  UnityDefaultTestRun(test_CmdConnect,"test_CmdConnect",0xa9);
  UnityDefaultTestRun(test_CmdDisconnect,"test_CmdDisconnect",0xaa);
  UnityDefaultTestRun(test_CmdSynch,"test_CmdSynch",0xab);
  UnityDefaultTestRun(test_CmdGetCommModeInfo,"test_CmdGetCommModeInfo",0xac);
  UnityDefaultTestRun(test_CmdGetStatus,"test_CmdGetStatus",0xad);
  UnityDefaultTestRun(test_CmdUserCmd,"test_CmdUserCmd",0xae);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
  UNITY_BEGIN();

  RUN_TEST(test_CmdConnect);
  RUN_TEST(test_CmdDisconnect);
  RUN_TEST(test_CmdSynch);
  RUN_TEST(test_CmdGetCommModeInfo);
  RUN_TEST(test_CmdGetStatus);
  RUN_TEST(test_CmdUserCmd);
//  RUN_TEST(test_CmdGetDaqProcessorInfo);
//  RUN_TEST(test_CmdGetDaqResolutionInfo);

  return UNITY_END();
}